

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerMultiBr(Lowerer *this,Instr *instr)

{
  char cVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  undefined4 *puVar6;
  MultiBranchInstr *multiBrInstr;
  RegOpnd *indexOpnd;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  
  pIVar2 = instr->m_prev;
  if ((instr->m_src1 == (Opnd *)0x0) || (instr->m_src2 != (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2809,"(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr)",
                       "Expected 1 src opnd on BrB");
    if (!bVar4) goto LAB_005b5c4f;
    *puVar6 = 0;
  }
  if (instr->m_kind == InstrKindBranch) {
    cVar1 = *(char *)((long)&instr[1]._vptr_Instr + 1);
    if (instr[1].m_next != (Instr *)0x0) {
      if (cVar1 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
        if (!bVar4) goto LAB_005b5c4f;
        *puVar6 = 0;
      }
      goto LAB_005b5aba;
    }
    if (cVar1 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
      ;
      error = "(m_isMultiBranch)";
      message = "m_isMultiBranch";
      lineNumber = 0x20e;
      goto LAB_005b5afb;
    }
  }
  else {
LAB_005b5aba:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
    ;
    error = "(instr->IsBranchInstr() && instr->AsBranchInstr()->IsMultiBranch())";
    message = "Bad Instruction Lowering Call to LowerMultiBr()";
    lineNumber = 0x280a;
LAB_005b5afb:
    bVar4 = Js::Throw::ReportAssert(fileName,lineNumber,error,message);
    if (!bVar4) goto LAB_005b5c4f;
    *puVar6 = 0;
  }
  if (instr->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar4) goto LAB_005b5c4f;
    *puVar6 = 0;
  }
  multiBrInstr = IR::BranchInstr::AsMultiBrInstr((BranchInstr *)instr);
  indexOpnd = (RegOpnd *)IR::Instr::UnlinkSrc1(instr);
  OVar5 = IR::Opnd::GetKind((Opnd *)indexOpnd);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) {
LAB_005b5c4f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  LowerJumpTableMultiBranch(this,multiBrInstr,indexOpnd);
  return pIVar2;
}

Assistant:

IR::Instr* Lowerer::LowerMultiBr(IR::Instr * instr)
{
    IR::Instr * instrPrev = instr->m_prev;

    AssertMsg(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr, "Expected 1 src opnd on BrB");
    AssertMsg(instr->IsBranchInstr() && instr->AsBranchInstr()->IsMultiBranch(), "Bad Instruction Lowering Call to LowerMultiBr()");

    IR::MultiBranchInstr * multiBrInstr = instr->AsBranchInstr()->AsMultiBrInstr();
    IR::RegOpnd * offset = instr->UnlinkSrc1()->AsRegOpnd();
    LowerJumpTableMultiBranch(multiBrInstr, offset);

    return instrPrev;
}